

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O0

void __thiscall
CNetTokenCache::AddToken(CNetTokenCache *this,NETADDR *pAddr,TOKEN Token,int TokenFLag)

{
  int iVar1;
  TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1> *this_00;
  int64 iVar2;
  CAddressInfo *__dest;
  uint in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  CNetBase *in_RDI;
  long in_FS_OFFSET;
  CConnlessPacketInfo *pNext;
  bool Found;
  CConnlessPacketInfo *pInfo;
  CConnlessPacketInfo *pPrevInfo;
  CAddressInfo Info;
  NETADDR NullAddr;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  CNetTokenManager *in_stack_ffffffffffffff50;
  NETADDR *in_stack_ffffffffffffff58;
  void *pData;
  NETADDR *pNVar3;
  undefined4 in_stack_ffffffffffffff70;
  int iVar4;
  NETADDR *local_70;
  NETADDR *local_68;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  uchar *local_28;
  undefined4 local_20 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX != -1) {
    local_68 = (NETADDR *)0x0;
    pNVar3 = *(NETADDR **)(in_RDI->m_Huffman).m_aNodes[0x9f].m_aLeafs;
    while (local_70 = pNVar3, local_70 != (NETADDR *)0x0) {
      memset(local_20,0,0x18);
      local_20[0] = 7;
      iVar1 = net_addr_comp(in_stack_ffffffffffffff58,(NETADDR *)in_stack_ffffffffffffff50,
                            in_stack_ffffffffffffff4c);
      if ((iVar1 == 0) ||
         (((in_ECX & 1) != 0 &&
          (iVar1 = net_addr_comp(in_stack_ffffffffffffff58,(NETADDR *)in_stack_ffffffffffffff50,
                                 in_stack_ffffffffffffff4c), iVar1 == 0)))) {
        iVar1 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
        if (*(long *)(local_70[0x3c].ip + 4) != 0) {
          (**(code **)(local_70[0x3c].ip + 4))
                    (local_70[0x3c].type,*(undefined8 *)(local_70[0x3c].ip + 0xc));
        }
        pData = *(void **)((in_RDI->m_Huffman).m_aNodes + 0xa0);
        pNVar3 = local_70;
        iVar4 = in_EDX;
        CNetTokenManager::GenerateToken
                  (in_stack_ffffffffffffff50,
                   (NETADDR *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        CNetBase::SendPacketConnless
                  (in_RDI,(NETADDR *)CONCAT44(iVar4,in_stack_ffffffffffffff70),
                   (TOKEN)((ulong)pNVar3 >> 0x20),(TOKEN)pNVar3,pData,iVar1);
        pNVar3 = *(NETADDR **)(local_70 + 0x3d);
        if (local_68 != (NETADDR *)0x0) {
          *(NETADDR **)(local_68 + 0x3d) = pNVar3;
        }
        if (local_70 == *(NETADDR **)(in_RDI->m_Huffman).m_aNodes[0x9f].m_aLeafs) {
          *(NETADDR **)(in_RDI->m_Huffman).m_aNodes[0x9f].m_aLeafs = pNVar3;
        }
        in_stack_ffffffffffffff58 = local_70;
        if (local_70 != (NETADDR *)0x0) {
          operator_delete(local_70,0x5c0);
          in_stack_ffffffffffffff58 = local_70;
        }
      }
      else {
        if (local_68 == (NETADDR *)0x0) {
          local_68 = local_70;
        }
        else {
          local_68 = *(NETADDR **)(local_68 + 0x3d);
        }
        pNVar3 = *(NETADDR **)(local_70 + 0x3d);
      }
    }
    if ((in_ECX & 2) == 0) {
      local_48 = *in_RSI;
      local_40 = in_RSI[1];
      local_38 = in_RSI[2];
      this_00 = (TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1> *)time_get();
      iVar2 = time_freq();
      local_28 = this_00->m_aBuffer + iVar2 * 0x10 + -0x28;
      __dest = TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1>::Allocate
                         (this_00,in_stack_ffffffffffffff4c);
      memcpy(__dest,&local_48,0x28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetTokenCache::AddToken(const NETADDR *pAddr, TOKEN Token, int TokenFLag)
{
	if(Token == NET_TOKEN_NONE)
		return;

	// search the list of packets to be sent
	// for this address
	CConnlessPacketInfo *pPrevInfo = 0;
	CConnlessPacketInfo *pInfo = m_pConnlessPacketList;
	bool Found = false;
	while(pInfo)
	{
		NETADDR NullAddr = { 0 };
		NullAddr.type = 7;	// cover broadcasts
		if(net_addr_comp(&pInfo->m_Addr, pAddr, true) == 0 || ((TokenFLag&NET_TOKENFLAG_ALLOWBROADCAST) && net_addr_comp(&pInfo->m_Addr, &NullAddr, false) == 0))
		{
			// notify the user that the packet gets delivered
			if(pInfo->m_pfnCallback)
				pInfo->m_pfnCallback(pInfo->m_TrackID, pInfo->m_pCallbackUser);
			m_pNetBase->SendPacketConnless(&(pInfo->m_Addr), Token, m_pTokenManager->GenerateToken(pAddr), pInfo->m_aData, pInfo->m_DataSize);
			CConnlessPacketInfo *pNext = pInfo->m_pNext;
			if(pPrevInfo)
				pPrevInfo->m_pNext = pNext;
			if(pInfo == m_pConnlessPacketList)
				m_pConnlessPacketList = pNext;
			delete pInfo;
			pInfo = pNext;
		}
		else
		{
			if(pPrevInfo)
				pPrevInfo = pPrevInfo->m_pNext;
			else
				pPrevInfo = pInfo;
			pInfo = pInfo->m_pNext;
		}
	}

	// add the token
	if(Found || !(TokenFLag&NET_TOKENFLAG_RESPONSEONLY))
	{
		CAddressInfo Info;
		Info.m_Addr = *pAddr;
		Info.m_Token = Token;
		Info.m_Expiry = time_get() + time_freq() * NET_TOKENCACHE_ADDRESSEXPIRY;
		(*m_TokenCache.Allocate(sizeof(Info))) = Info;
	}
}